

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void anon_unknown.dwarf_23de0c::PulseMainloop::streamStateCallbackC(pa_stream *stream,void *pdata)

{
  pa_stream *in_RDI;
  PulseMainloop *unaff_retaddr;
  
  streamStateCallback(unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void streamStateCallbackC(pa_stream *stream, void *pdata) noexcept
    { static_cast<PulseMainloop*>(pdata)->streamStateCallback(stream); }